

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O3

void smallDeletions(RefVector *ref,vector<SoftCluster,_std::allocator<SoftCluster>_> *scClustersUp,
                   vector<SoftCluster,_std::allocator<SoftCluster>_> *scClustersDown,
                   vector<OutNode,_std::allocator<OutNode>_> *smallOutput)

{
  SoftCluster *pSVar1;
  pointer pRVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  pair<int,_int> pVar7;
  pointer pSVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  SoftCluster *c2;
  pointer pSVar13;
  SoftCluster *pSVar14;
  int iVar15;
  int iVar16;
  OutNode on;
  SoftCluster scUp;
  OutNode local_f8;
  SoftCluster local_c0;
  ulong uVar17;
  
  pSVar14 = (scClustersUp->super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pSVar1 = (scClustersUp->super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (pSVar14 == pSVar1) {
      return;
    }
    SoftCluster::SoftCluster(&local_c0,pSVar14);
    uVar5 = getIdx(local_c0.info.scPos + 0x2d,scClustersDown);
    if (uVar5 != 0xffffffff) {
      uVar11 = (ulong)uVar5;
      pSVar8 = (scClustersDown->super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pSVar13 = (scClustersDown->super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      uVar9 = ((long)pSVar13 - (long)pSVar8 >> 4) * -0x71c71c71c71c71c7;
      if (uVar11 <= uVar9 && uVar9 - uVar11 != 0) {
        iVar6 = pSVar8[uVar11].info.scPos - local_c0.info.scPos;
        uVar17 = 0xffffffff;
        iVar16 = -1;
        if (iVar6 < 0x1fa) {
          c2 = pSVar8 + uVar11;
          lVar12 = uVar11 * 0x90;
          iVar15 = 0;
          do {
            if (0x2c < iVar6) {
              bVar4 = overlapCC(&local_c0,c2);
              pSVar8 = (scClustersDown->
                       super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              pSVar13 = (scClustersDown->
                        super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
              if (bVar4) {
                uVar9 = ((long)pSVar13 - (long)pSVar8 >> 4) * -0x71c71c71c71c71c7;
                if (uVar9 < uVar11 || uVar9 - uVar11 == 0) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar11);
                }
                iVar6 = (int)((ulong)(*(long *)((long)&(pSVar8->nodes).
                                                                                                              
                                                  super__Vector_base<SoftNode,_std::allocator<SoftNode>_>
                                                  ._M_impl + lVar12 + 8) -
                                     *(long *)((long)&(pSVar8->nodes).
                                                                                                            
                                                  super__Vector_base<SoftNode,_std::allocator<SoftNode>_>
                                                  ._M_impl + lVar12)) >> 3) * -0x11111111 +
                        (int)((ulong)((long)local_c0.nodes.
                                            super__Vector_base<SoftNode,_std::allocator<SoftNode>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_c0.nodes.
                                           super__Vector_base<SoftNode,_std::allocator<SoftNode>_>.
                                           _M_impl.super__Vector_impl_data._M_start) >> 3) *
                        -0x11111111;
                if (iVar15 < iVar6) {
                  uVar17 = uVar11 & 0xffffffff;
                }
                if (iVar15 <= iVar6) {
                  iVar15 = iVar6;
                }
              }
            }
            iVar16 = (int)uVar17;
            uVar11 = uVar11 + 1;
            uVar9 = ((long)pSVar13 - (long)pSVar8 >> 4) * -0x71c71c71c71c71c7;
            if (uVar9 < uVar11 || uVar9 - uVar11 == 0) break;
            c2 = pSVar8 + uVar11;
            iVar6 = *(int *)((long)&pSVar8[1].info.scPos + lVar12) - local_c0.info.scPos;
            lVar12 = lVar12 + 0x90;
          } while (iVar6 < 0x1fa);
        }
        if (iVar16 != -1) {
          uVar11 = (ulong)iVar16;
          if (uVar9 <= uVar11) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar11);
          }
          pVar7 = calcSup(&local_c0.nodes,&pSVar8[uVar11].nodes);
          iVar6 = local_c0.info.scPos;
          uVar17 = (ulong)local_c0.info.refID;
          pRVar2 = (ref->super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar10 = ((long)(ref->
                          super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>)
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar2 >> 3) *
                   -0x3333333333333333;
          uVar9 = uVar17;
          if ((uVar10 < uVar17 || uVar10 - uVar17 == 0) ||
             (pSVar8 = (scClustersDown->
                       super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>)._M_impl.
                       super__Vector_impl_data._M_start,
             uVar10 = ((long)(scClustersDown->
                             super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pSVar8 >> 4) *
                      -0x71c71c71c71c71c7, uVar9 = uVar11, uVar10 < uVar11 || uVar10 - uVar11 == 0))
          {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar9);
          }
          iVar16 = pSVar8[uVar11].info.scPos;
          local_f8.chr._M_dataplus._M_p = (pointer)&local_f8.chr.field_2;
          _Var3._M_p = pRVar2[uVar17].RefName._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f8,_Var3._M_p,
                     _Var3._M_p + pRVar2[uVar17].RefName._M_string_length);
          local_f8.st = iVar6;
          local_f8.supDisc = 0;
          local_f8.supSR = pVar7.first;
          local_f8.supSC = pVar7.second;
          local_f8.en = iVar16;
          std::vector<OutNode,std::allocator<OutNode>>::emplace_back<OutNode&>
                    ((vector<OutNode,std::allocator<OutNode>> *)smallOutput,&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8.chr._M_dataplus._M_p != &local_f8.chr.field_2) {
            operator_delete(local_f8.chr._M_dataplus._M_p);
          }
        }
      }
    }
    std::vector<SoftNode,_std::allocator<SoftNode>_>::~vector(&local_c0.nodes);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.info.readName._M_dataplus._M_p != &local_c0.info.readName.field_2) {
      operator_delete(local_c0.info.readName._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.info.seq._M_dataplus._M_p != &local_c0.info.seq.field_2) {
      operator_delete(local_c0.info.seq._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.info.refName._M_dataplus._M_p != &local_c0.info.refName.field_2) {
      operator_delete(local_c0.info.refName._M_dataplus._M_p);
    }
    pSVar14 = pSVar14 + 1;
  } while( true );
}

Assistant:

void smallDeletions(const BamTools::RefVector &ref, const std::vector<SoftCluster> &scClustersUp, const std::vector<SoftCluster> &scClustersDown, std::vector<OutNode> &smallOutput)
{
	for (SoftCluster scUp : scClustersUp)
	{
		int stBound = getIdx(scUp.info.scPos + MIN_SMALL_DEL_LEN, scClustersDown);

		if (stBound == -1)
			continue;

		int bestIdx = -1, bestSup = 0;
		for (int i = stBound; i < scClustersDown.size(); ++i)
		{
			if (scClustersDown.at(i).info.scPos - scUp.info.scPos > MAX_SMALL_DEL_LEN)
				break;
			if (scClustersDown.at(i).info.scPos - scUp.info.scPos < MIN_SMALL_DEL_LEN)
				continue;
			if (overlapCC(scUp, scClustersDown.at(i)))
			{
				int curSup = scUp.nodes.size() + scClustersDown.at(i).nodes.size();
				if (curSup > bestSup)
				{
					bestSup = curSup;
					bestIdx = i;
				}
			}
		}
		if (bestIdx != -1)
		{
			std::pair<int, int> sup = calcSup(scUp.nodes, scClustersDown.at(bestIdx).nodes);
			OutNode on(ref.at(scUp.info.refID).RefName, scUp.info.scPos, scClustersDown.at(bestIdx).info.scPos, 0, sup.first, sup.second);
			smallOutput.emplace_back(on);
		}
	}
}